

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O3

FUNCTION_RETURN generate_user_pc_signature(char *identifier_out,IDENTIFICATION_STRATEGY strategy)

{
  FUNCTION_RETURN FVar1;
  PcIdentifier *identifiers;
  ulong uVar2;
  unsigned_long _zzq_result;
  uint req_buffer_size;
  unsigned_long _zzq_args [6];
  uint local_74;
  char *local_70;
  undefined8 local_68;
  PcIdentifier *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_74 = 0;
  local_70 = identifier_out;
  FVar1 = generate_pc_id((PcIdentifier *)0x0,&local_74,strategy);
  if (FVar1 == FUNC_RET_OK) {
    if (local_74 == 0) {
      FVar1 = FUNC_RET_ERROR;
    }
    else {
      uVar2 = 2;
      if (2 < local_74) {
        uVar2 = (ulong)local_74;
      }
      local_74 = (uint)uVar2;
      identifiers = (PcIdentifier *)calloc(1,uVar2 * 6);
      FVar1 = generate_pc_id(identifiers,&local_74,strategy);
      if (FVar1 == FUNC_RET_OK) {
        local_68 = 0x4d430005;
        local_60 = identifiers + 1;
        local_58 = 6;
        local_50 = 0;
        local_48 = 0;
        local_40 = 0;
        FVar1 = encode_pc_id((uchar *)identifiers,*local_60,identifier_out);
        local_68 = 0x4d430005;
        local_60 = (PcIdentifier *)&local_70;
        local_58 = 8;
        local_50 = 0;
        local_48 = 0;
        local_40 = 0;
      }
      free(identifiers);
    }
  }
  return FVar1;
}

Assistant:

FUNCTION_RETURN generate_user_pc_signature(PcSignature identifier_out,
		IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	PcIdentifier* identifiers;
	unsigned int req_buffer_size = 0;
	result = generate_pc_id(NULL, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		return result;
	}
	if (req_buffer_size == 0) {
		return FUNC_RET_ERROR;
	}
	req_buffer_size = req_buffer_size < 2 ? 2 : req_buffer_size;
	identifiers = (PcIdentifier *) malloc(
			sizeof(PcIdentifier) * req_buffer_size);
	memset(identifiers, 0, sizeof(PcIdentifier) * req_buffer_size);
	result = generate_pc_id(identifiers, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		free(identifiers);
		return result;
	}
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[0]);
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[1]);
#endif
	result = encode_pc_id(identifiers[0], identifiers[1], identifier_out);
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifier_out);
#endif
	free(identifiers);
	return result;
}